

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Fail
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,HRESULT error)

{
  bool isBody;
  code *pcVar1;
  bool bVar2;
  ParseError *this_00;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  isBody = this->inBody;
  uVar5 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0xfffffffd < (long)uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) goto LAB_00ec792b;
    *puVar3 = 0;
  }
  uVar4 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0xfffffffd < (long)uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) {
LAB_00ec792b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ParseError::ParseError(this_00,isBody,(CharCount)(uVar5 >> 1),(CharCount)(uVar4 >> 1),error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }